

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# infill.cpp
# Opt level: O0

void sigint_handler(int signo)

{
  undefined4 in_EAX;
  common_log *pcVar1;
  EVP_PKEY_CTX *in_RDI;
  undefined4 unaff_retaddr;
  common_sampler *gsmpl;
  
  gsmpl = (common_sampler *)CONCAT44((int)in_RDI,in_EAX);
  if ((int)in_RDI == 2) {
    if (is_interacting) {
      console::cleanup(in_RDI);
      if (-1 < common_log_verbosity_thold) {
        pcVar1 = common_log_main();
        common_log_add(pcVar1,GGML_LOG_LEVEL_NONE,"\n");
      }
      common_perf_print((llama_context *)CONCAT44(signo,unaff_retaddr),gsmpl);
      if (-1 < common_log_verbosity_thold) {
        pcVar1 = common_log_main();
        common_log_add(pcVar1,GGML_LOG_LEVEL_NONE,"Interrupted by user\n");
      }
      common_log_main();
      common_log_pause((common_log *)0x17adae);
      _exit(0x82);
    }
    is_interacting = true;
  }
  return;
}

Assistant:

static void sigint_handler(int signo) {
    if (signo == SIGINT) {
        if (!is_interacting) {
            is_interacting = true;
        } else {
            console::cleanup();
            LOG("\n");
            common_perf_print(*g_ctx, *g_smpl);

            // make sure all logs are flushed
            LOG("Interrupted by user\n");
            common_log_pause(common_log_main());

            _exit(130);
        }
    }
}